

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Ptr_t * Aig_ManDfsArray(Aig_Man_t *p,Aig_Obj_t **pNodes,int nNodes)

{
  Aig_Obj_t *Entry;
  Vec_Ptr_t *p_00;
  ulong uVar1;
  ulong uVar2;
  
  Aig_ManIncrementTravId(p);
  p_00 = Vec_PtrAlloc(p->vObjs->nSize);
  Entry = p->pConst1;
  Entry->TravId = p->nTravIds;
  Vec_PtrPush(p_00,Entry);
  uVar2 = 0;
  uVar1 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    Aig_ManDfsAll_rec(p,pNodes[uVar2],p_00);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsArray( Aig_Man_t * p, Aig_Obj_t ** pNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    for ( i = 0; i < nNodes; i++ )
        Aig_ManDfsAll_rec( p, pNodes[i], vNodes );
    return vNodes;
}